

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_entropy.c
# Opt level: O0

void accumulate_observations
               (int *src,int *dst,int *back,size_t l,size_t n,size_t m,int b,size_t k,
               inform_dist *states,inform_dist *histories,inform_dist *sources,
               inform_dist *predicates)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong local_78;
  size_t u;
  size_t j_1;
  size_t j;
  int q;
  int history;
  int back_state;
  int predicate;
  int source;
  int state;
  int future;
  int src_state;
  size_t i;
  size_t m_local;
  size_t n_local;
  size_t l_local;
  int *back_local;
  int *dst_local;
  int *src_local;
  
  back_local = dst;
  dst_local = src;
  for (_future = 0; _future < n; _future = _future + 1) {
    j._4_4_ = 0;
    j._0_4_ = 1;
    for (j_1 = 0; j_1 < k; j_1 = j_1 + 1) {
      j._0_4_ = b * (int)j;
      j._4_4_ = back_local[j_1] + b * j._4_4_;
    }
    for (u = k; u < m; u = u + 1) {
      q = 0;
      for (local_78 = 0; local_78 < l; local_78 = local_78 + 1) {
        q = b * q + back[u + m * (_future + n * local_78) + -1];
      }
      iVar1 = q * (int)j + j._4_4_;
      iVar2 = iVar1 * b + dst_local[u - 1];
      iVar3 = iVar1 * b + back_local[u];
      iVar4 = iVar3 * b + dst_local[u - 1];
      states->histogram[iVar4] = states->histogram[iVar4] + 1;
      histories->histogram[iVar1] = histories->histogram[iVar1] + 1;
      sources->histogram[iVar2] = sources->histogram[iVar2] + 1;
      predicates->histogram[iVar3] = predicates->histogram[iVar3] + 1;
      j._4_4_ = iVar3 - (back_local[u - k] + q * b) * (int)j;
    }
    dst_local = dst_local + m;
    back_local = back_local + m;
  }
  return;
}

Assistant:

static void accumulate_observations(int const* series, size_t n, size_t m,
    int b, size_t k, inform_dist *states)
{
    k -= 1;
    for (size_t i = 0; i < n; ++i, series += m)
    {
        int history = 0, q = 1, state;
        for (size_t j = 0; j < k; ++j)
        {
            q *= b;
            history *= b;
            history += series[j];
        }
        for (size_t j = k; j < m; ++j)
        {
            state  = history * b + series[j];
            states->histogram[state]++;
            history = state - series[j - k]*q;
        }
    }
}